

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<true,_true,_true>::~DaTrie(DaTrie<true,_true,_true> *this)

{
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  
  std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::~vector
            ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)unaff_retaddr);
  std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::~vector
            ((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)unaff_retaddr);
  std::vector<char,_std::allocator<char>_>::~vector(unaff_retaddr);
  std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::~vector
            ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)unaff_retaddr);
  return;
}

Assistant:

~DaTrie() {}